

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::uadd_carry_invalid_carry
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction function;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_ffffffffffffff10;
  allocator<char> local_e1;
  long local_e0;
  long local_d8;
  string shaderSource;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"uaddCarry: Invalid carry type.",(allocator<char> *)&local_90);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar2];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      local_d8 = lVar2;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_e1);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      lVar2 = 0;
      while (lVar2 != 4) {
        function = deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[lVar2];
        local_e0 = lVar2;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_EVALUATION,
                   function,function,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar2],
                   in_stack_ffffffffffffff10);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_EVALUATION,
                   function,function,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[local_e0],
                   in_stack_ffffffffffffff10);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
          if (*(ShaderFunction *)
               ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar2) !=
              function) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_EVALUATION,
                       function,function,
                       *(ShaderFunction *)
                        ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                        lVar2),in_stack_ffffffffffffff10);
            std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
        }
        lVar2 = local_e0 + 1;
      }
      NegativeTestContext::endSection(ctx);
      lVar2 = local_d8;
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void uadd_carry_invalid_carry (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("uaddCarry: Invalid carry type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx2)
				{
					if (s_uintTypes[dataTypeNdx2] == s_uintTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx2]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}